

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O3

int lj_cf_ffi_meta___index(lua_State *L)

{
  cTValue *key;
  CTState *cts;
  anon_struct_8_2_7fa0a05d_for_TValue_4 aVar1;
  uint64_t uVar2;
  int iVar3;
  int iVar4;
  CType *ct;
  CTInfo qual;
  uint8_t *p;
  CTInfo local_2c;
  uint8_t *local_28;
  
  cts = *(CTState **)((L->glref).ptr64 + 0x180);
  cts->L = L;
  local_2c = 0;
  key = L->base + 1;
  if ((key < L->top) && (aVar1 = L->base->field_4, aVar1.it >> 0xf == 0x1fff5)) {
    ct = lj_cdata_index(cts,(GCcdata *)((ulong)aVar1 & 0x7fffffffffff),key,&local_28,&local_2c);
    if ((local_2c & 1) == 0) {
      iVar3 = lj_cdata_get(cts,ct,L->top + -1,local_28);
      iVar4 = 1;
      if ((iVar3 != 0) &&
         (uVar2 = (L->glref).ptr64, *(ulong *)(uVar2 + 0x18) <= *(ulong *)(uVar2 + 0x10))) {
        lj_gc_step(L);
      }
    }
    else {
      iVar4 = ffi_index_meta(L,cts,ct,MM_index);
    }
    return iVar4;
  }
  lj_err_argt(L,1,10);
}

Assistant:

LJLIB_CF(ffi_meta___index)	LJLIB_REC(cdata_index 0)
{
  CTState *cts = ctype_cts(L);
  CTInfo qual = 0;
  CType *ct;
  uint8_t *p;
  TValue *o = L->base;
  if (!(o+1 < L->top && tviscdata(o)))  /* Also checks for presence of key. */
    lj_err_argt(L, 1, LUA_TCDATA);
  ct = lj_cdata_index(cts, cdataV(o), o+1, &p, &qual);
  if ((qual & 1))
    return ffi_index_meta(L, cts, ct, MM_index);
  if (lj_cdata_get(cts, ct, L->top-1, p))
    lj_gc_check(L);
  return 1;
}